

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall pegmatite::Context::do_parse_procs(Context *this,void *d)

{
  pointer pPVar1;
  pointer pPVar2;
  bool bVar3;
  pointer pPVar4;
  function<bool_(const_pegmatite::InputRange_&,_void_*)> local_50;
  
  pPVar1 = (this->matches).
           super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pPVar2 = (this->matches).
           super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    pPVar4 = pPVar2;
    if (pPVar4 == pPVar1) break;
    (**this->delegate->_vptr_ParserDelegate)(&local_50,this->delegate,pPVar4->matched_rule);
    if (local_50.super__Function_base._M_manager == (_Manager_type)0x0) {
      __assert_fail("p",
                    "/workspace/llm4binary/github/license_c_cmakelists/CompilerTeaching[P]Pegmatite/parser.cc"
                    ,0x12f,"bool pegmatite::Context::do_parse_procs(void *) const");
    }
    bVar3 = std::function<bool_(const_pegmatite::InputRange_&,_void_*)>::operator()
                      (&local_50,&pPVar4->source,d);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    pPVar2 = pPVar4 + 1;
  } while (bVar3);
  return pPVar4 == pPVar1;
}

Assistant:

bool do_parse_procs(void *d) const
	{
		for(const auto &m : matches)
		{
			const parse_proc &p = get_parse_proc(*(m.matched_rule));
			assert(p);
			if (!p(m.source, d))
				return false;
		}

		return true;
	}